

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O3

void SignTransactionResultToJSON
               (CMutableTransaction *mtx,bool complete,
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               *coins,map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
                      *input_errors,UniValue *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uchar *puVar3;
  CScript *pCVar4;
  long lVar5;
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  size_type sVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer pbVar9;
  int iVar10;
  pointer pvVar11;
  _Base_ptr p_Var12;
  UniValue *this;
  vector<UniValue,_std::allocator<UniValue>_> *vec;
  UniValue *pUVar13;
  CTxOut *this_00;
  undefined8 uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  pointer pCVar18;
  long in_FS_OFFSET;
  bool bVar19;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  UniValue entry;
  UniValue vErrors;
  UniValue witness;
  size_t i;
  _Base_ptr p_Var20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  _Base_ptr in_stack_fffffffffffff920;
  undefined7 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  undefined8 in_stack_fffffffffffff938;
  _Alloc_hider _Var21;
  undefined8 in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff948;
  undefined8 in_stack_fffffffffffff950;
  pointer in_stack_fffffffffffff958;
  pointer in_stack_fffffffffffff960;
  pointer in_stack_fffffffffffff968;
  vector<UniValue,_std::allocator<UniValue>_> local_690;
  long *local_678 [2];
  long local_668 [2];
  UniValue local_658;
  long *local_600 [2];
  long local_5f0 [2];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [8];
  undefined1 local_5c8 [24];
  pointer pbStack_5b0;
  undefined1 local_5a8 [24];
  pointer pUStack_590;
  UniValue local_560;
  long *local_508 [2];
  long local_4f8 [2];
  undefined1 *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8 [9];
  undefined4 local_4cf;
  undefined2 local_4cb;
  char local_4c9;
  UniValue local_4c8;
  VType local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  pointer local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  vector<UniValue,_std::allocator<UniValue>_> local_430;
  UniValue local_418;
  undefined4 *local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined1 uStack_3ac;
  undefined1 uStack_3ab;
  undefined2 uStack_3aa;
  UniValue local_3a0;
  long *local_348;
  undefined8 local_340;
  long local_338;
  undefined1 local_330;
  UniValue local_328;
  long *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  undefined1 local_2b8;
  undefined1 local_2b7;
  VType local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  vector<UniValue,_std::allocator<UniValue>_> local_270;
  undefined4 *local_258;
  undefined8 local_250;
  undefined4 local_248;
  undefined4 uStack_244;
  string local_238;
  UniValue local_218;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  uint7 uStack_1af;
  undefined8 uStack_1a8;
  size_type *local_1a0;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<UniValue,_std::allocator<UniValue>_> vStack_160;
  UniValue local_148;
  undefined4 *local_f0;
  undefined8 local_e8;
  undefined4 local_e0;
  uint uStack_dc;
  undefined1 local_d0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<UniValue,_std::allocator<UniValue>_> local_90;
  undefined4 *local_78;
  undefined8 local_70;
  undefined4 local_68;
  uint uStack_64;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  uint7 uStack_47;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_4e8 = local_4d8;
  local_4c8.val._M_dataplus._M_p = (pointer)&local_4c8.val.field_2;
  local_4c8.typ = VARR;
  local_4c8.val.field_2._M_local_buf[0] = '\0';
  local_4c8.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_4d8._1_8_;
  local_4c8.val.field_2._M_local_buf[8] = SUB81(local_4d8._1_8_,7);
  local_4c8.val.field_2._9_4_ = local_4cf;
  local_4c8.val.field_2._13_2_ = local_4cb;
  local_4c8.val.field_2._M_local_buf[0xf] = local_4c9;
  local_4c8.val._M_string_length = 0;
  local_4e0 = 0;
  local_4d8[0] = 0;
  local_4c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var12 = (input_errors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var20 = &(input_errors->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var12 != p_Var20) {
    do {
      in_stack_fffffffffffff918 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &p_Var12[1]._M_parent;
      iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(in_stack_fffffffffffff918,"Missing amount");
      if (iVar10 == 0) {
        pUVar13 = (UniValue *)__cxa_allocate_exception(0x58);
        uVar17 = (ulong)(int)p_Var12[1]._M_color;
        pCVar18 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar16 = ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pCVar18 >> 3) * 0x4ec4ec4ec4ec4ec5
        ;
        if (uVar16 < uVar17 || uVar16 - uVar17 == 0) {
LAB_0036ce84:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar14 = std::__throw_out_of_range_fmt
                               (
                               "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               );
            UniValue::~UniValue(&local_4c8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar14);
            }
          }
        }
        else {
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (uVar17 * 0x68);
          this_00 = &std::
                     map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                     ::at(coins,(key_type *)((long)&(args->_M_dataplus)._M_p + (long)pCVar18))->out;
          CTxOut::ToString_abi_cxx11_((string *)local_d0,this_00);
          tinyformat::format<std::__cxx11::string>
                    ((string *)local_5e0,(tinyformat *)"Missing amount for %s",local_d0,args);
          JSONRPCError(pUVar13,-3,(string *)local_5e0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pUVar13,&UniValue::typeinfo,UniValue::~UniValue);
          }
        }
        goto LAB_0036d321;
      }
      uVar17 = (ulong)(int)p_Var12[1]._M_color;
      pCVar18 = (mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar16 = ((long)(mtx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar18 >> 3) * 0x4ec4ec4ec4ec4ec5;
      if (uVar16 < uVar17 || uVar16 - uVar17 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_0036ce84;
        }
        goto LAB_0036d321;
      }
      pCVar18 = pCVar18 + uVar17;
      local_5e0._0_4_ = 1;
      local_5e0._8_8_ = local_5d0 + 8;
      local_58 = &local_48;
      local_5c8._0_8_ = (ulong)uStack_47 << 8;
      local_5c8._8_8_ = uStack_40;
      local_5d0 = (undefined1  [8])0x0;
      local_50 = 0;
      local_48 = 0;
      local_5a8._16_8_ = (pointer)0x0;
      pUStack_590 = (pointer)0x0;
      local_5a8._0_8_ = (pointer)0x0;
      local_5a8._8_8_ = (pointer)0x0;
      local_5c8._16_8_ = (pointer)0x0;
      pbStack_5b0 = (pointer)0x0;
      local_78 = &local_68;
      local_68 = 0x64697874;
      local_70 = 4;
      uStack_64 = uStack_64 & 0xffffff00;
      base_blob<256u>::ToString_abi_cxx11_((string *)&local_1a0,pCVar18);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0);
      key._M_string_length = (size_type)mtx;
      key._M_dataplus._M_p = (pointer)result;
      key.field_2._M_allocated_capacity = (size_type)coins;
      key.field_2._8_8_ = p_Var20;
      val_01.val._M_dataplus._M_p = (pointer)p_Var12;
      val_01._0_8_ = in_stack_fffffffffffff918;
      val_01.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
      val_01.val._M_string_length._7_1_ = complete;
      val_01.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
      val_01.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
      val_01.val.field_2._8_8_ = in_stack_fffffffffffff938;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
      val_01.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
      val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
      UniValue::pushKV((UniValue *)local_5e0,key,val_01);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._8_8_ != &local_b8) {
        operator_delete((void *)local_d0._8_8_,local_b8._0_8_ + 1);
      }
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0,local_190 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT44(uStack_64,local_68) + 1);
      }
      local_f0 = &local_e0;
      local_e0 = 0x74756f76;
      local_e8 = 4;
      uStack_dc = uStack_dc & 0xffffff00;
      local_1a0 = (size_type *)(ulong)(pCVar18->prevout).n;
      UniValue::UniValue<unsigned_long,_unsigned_long,_true>(&local_148,(unsigned_long *)&local_1a0)
      ;
      key_00._M_string_length = (size_type)mtx;
      key_00._M_dataplus._M_p = (pointer)result;
      key_00.field_2._M_allocated_capacity = (size_type)coins;
      key_00.field_2._8_8_ = p_Var20;
      val_02.val._M_dataplus._M_p = (pointer)p_Var12;
      val_02._0_8_ = in_stack_fffffffffffff918;
      val_02.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
      val_02.val._M_string_length._7_1_ = complete;
      val_02.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
      val_02.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
      val_02.val.field_2._8_8_ = in_stack_fffffffffffff938;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
      val_02.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
      val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
      UniValue::pushKV((UniValue *)local_5e0,key_00,val_02);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_148.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_148.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.val._M_dataplus._M_p != &local_148.val.field_2) {
        operator_delete(local_148.val._M_dataplus._M_p,
                        local_148.val.field_2._M_allocated_capacity + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT44(uStack_dc,local_e0) + 1);
      }
      local_1a0 = (size_type *)CONCAT44(local_1a0._4_4_,2);
      local_198._M_p = (pointer)&local_188;
      local_1c0 = &local_1b0;
      local_188._M_allocated_capacity = (ulong)uStack_1af << 8;
      local_188._8_8_ = uStack_1a8;
      local_190 = 0;
      local_1b8 = 0;
      local_1b0 = 0;
      vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar11 = *(pointer *)
                 &(pCVar18->scriptWitness).stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ;
      if (*(pointer *)((long)&(pCVar18->scriptWitness).stack + 8) == pvVar11) {
        local_2b0 = VARR;
      }
      else {
        uVar16 = 0;
        uVar17 = 1;
        do {
          puVar3 = *(uchar **)
                    &pvVar11[uVar16].
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
          s.m_size = (long)*(pointer *)
                            ((long)&pvVar11[uVar16].
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl + 8) - (long)puVar3;
          s.m_data = puVar3;
          HexStr_abi_cxx11_(&local_238,s);
          UniValue::
          UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_218,&local_238);
          val.val._M_dataplus._M_p = (pointer)mtx;
          val._0_8_ = result;
          val.val._M_string_length = (size_type)coins;
          val.val.field_2._M_allocated_capacity = (size_type)p_Var20;
          val.val.field_2._8_8_ = in_stack_fffffffffffff918;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var12;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffff928;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._7_1_ = complete;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff930;
          val.keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffff934;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff938;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff940;
          val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff948;
          UniValue::push_back((UniValue *)&local_1a0,val);
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_218.values);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_218.keys);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218.val._M_dataplus._M_p != &local_218.val.field_2) {
            operator_delete(local_218.val._M_dataplus._M_p,
                            local_218.val.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          pvVar11 = *(pointer *)
                     &(pCVar18->scriptWitness).stack.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ;
          uVar16 = ((long)*(pointer *)((long)&(pCVar18->scriptWitness).stack + 8) - (long)pvVar11 >>
                   3) * -0x5555555555555555;
          bVar19 = uVar17 <= uVar16;
          lVar5 = uVar16 - uVar17;
          uVar16 = uVar17;
          uVar17 = (ulong)((int)uVar17 + 1);
        } while (bVar19 && lVar5 != 0);
        local_2b0 = (VType)local_1a0;
      }
      local_258 = &local_248;
      local_248 = 0x6e746977;
      local_250 = 7;
      uStack_244 = 0x737365;
      local_2a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_p == &local_188) {
        local_298._8_8_ = local_188._8_8_;
        local_2a8 = &local_298;
      }
      local_298._M_allocated_capacity = local_188._M_allocated_capacity;
      local_2a0 = local_190;
      local_190 = 0;
      local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_178.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_178.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_178.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start =
           vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_270.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_270.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_160.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key_01._M_string_length = (size_type)mtx;
      key_01._M_dataplus._M_p = (pointer)result;
      key_01.field_2._M_allocated_capacity = (size_type)coins;
      key_01.field_2._8_8_ = p_Var20;
      val_03.val._M_dataplus._M_p = (pointer)p_Var12;
      val_03._0_8_ = in_stack_fffffffffffff918;
      val_03.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
      val_03.val._M_string_length._7_1_ = complete;
      val_03.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
      val_03.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
      val_03.val.field_2._8_8_ = in_stack_fffffffffffff938;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
      val_03.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
      val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
      val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
      val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
      local_198._M_p = (pointer)&local_188;
      UniValue::pushKV((UniValue *)local_5e0,key_01,val_03);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_270);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_288);
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,local_298._M_allocated_capacity + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,CONCAT44(uStack_244,local_248) + 1);
      }
      local_2d0 = &local_2c0;
      local_2c0 = 0x6953747069726373;
      local_2b8 = 0x67;
      local_2c8 = 9;
      local_2b7 = 0;
      uVar2 = *(size_type *)((long)&(pCVar18->scriptSig).super_CScriptBase + 0x1c);
      uVar15 = uVar2 - 0x1d;
      pCVar4 = *(CScript **)&(pCVar18->scriptSig).super_CScriptBase._union;
      if (uVar2 < 0x1d) {
        uVar15 = uVar2;
        pCVar4 = &pCVar18->scriptSig;
      }
      s_00.m_size._0_4_ = uVar15;
      s_00.m_data = (uchar *)pCVar4;
      s_00.m_size._4_4_ = 0;
      HexStr_abi_cxx11_(&local_238,s_00);
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_328,&local_238);
      key_02._M_string_length = (size_type)mtx;
      key_02._M_dataplus._M_p = (pointer)result;
      key_02.field_2._M_allocated_capacity = (size_type)coins;
      key_02.field_2._8_8_ = p_Var20;
      val_04.val._M_dataplus._M_p = (pointer)p_Var12;
      val_04._0_8_ = in_stack_fffffffffffff918;
      val_04.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
      val_04.val._M_string_length._7_1_ = complete;
      val_04.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
      val_04.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
      val_04.val.field_2._8_8_ = in_stack_fffffffffffff938;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
      val_04.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
      val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
      UniValue::pushKV((UniValue *)local_5e0,key_02,val_04);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_328.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_328.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328.val._M_dataplus._M_p != &local_328.val.field_2) {
        operator_delete(local_328.val._M_dataplus._M_p,
                        local_328.val.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0 + 1);
      }
      local_348 = &local_338;
      local_338 = 0x65636e6575716573;
      local_340 = 8;
      local_330 = 0;
      local_238._M_dataplus._M_p = (pointer)(ulong)pCVar18->nSequence;
      UniValue::UniValue<unsigned_long,_unsigned_long,_true>(&local_3a0,(unsigned_long *)&local_238)
      ;
      key_03._M_string_length = (size_type)mtx;
      key_03._M_dataplus._M_p = (pointer)result;
      key_03.field_2._M_allocated_capacity = (size_type)coins;
      key_03.field_2._8_8_ = p_Var20;
      val_05.val._M_dataplus._M_p = (pointer)p_Var12;
      val_05._0_8_ = in_stack_fffffffffffff918;
      val_05.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
      val_05.val._M_string_length._7_1_ = complete;
      val_05.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
      val_05.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
      val_05.val.field_2._8_8_ = in_stack_fffffffffffff938;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
      val_05.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
      val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
      UniValue::pushKV((UniValue *)local_5e0,key_03,val_05);
      in_stack_fffffffffffff920 = p_Var12;
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3a0.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3a0.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0.val._M_dataplus._M_p != &local_3a0.val.field_2) {
        operator_delete(local_3a0.val._M_dataplus._M_p,
                        local_3a0.val.field_2._M_allocated_capacity + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      local_3c0 = &local_3b0;
      uStack_3ac = 0x72;
      local_3b0 = 0x6f727265;
      local_3b8 = 5;
      uStack_3ab = 0;
      UniValue::
      UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_418,in_stack_fffffffffffff918);
      key_04._M_string_length = (size_type)mtx;
      key_04._M_dataplus._M_p = (pointer)result;
      key_04.field_2._M_allocated_capacity = (size_type)coins;
      key_04.field_2._8_8_ = p_Var20;
      val_06.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff920;
      val_06._0_8_ = in_stack_fffffffffffff918;
      val_06.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
      val_06.val._M_string_length._7_1_ = complete;
      val_06.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
      val_06.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
      val_06.val.field_2._8_8_ = in_stack_fffffffffffff938;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
      val_06.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
      val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
      UniValue::pushKV((UniValue *)local_5e0,key_04,val_06);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_418.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_418.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418.val._M_dataplus._M_p != &local_418.val.field_2) {
        operator_delete(local_418.val._M_dataplus._M_p,
                        local_418.val.field_2._M_allocated_capacity + 1);
      }
      if (local_3c0 != &local_3b0) {
        operator_delete(local_3c0,
                        CONCAT26(uStack_3aa,CONCAT15(uStack_3ab,CONCAT14(uStack_3ac,local_3b0))) + 1
                       );
      }
      local_470 = local_5e0._0_4_;
      local_468 = &local_458;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5d0 + 8)) {
        local_458._8_8_ = local_5c8._8_8_;
      }
      else {
        local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5e0._8_8_;
      }
      local_458._M_allocated_capacity = local_5c8._0_8_;
      local_460 = (pointer)local_5d0;
      local_5d0 = (undefined1  [8])0x0;
      local_5c8._0_8_ = local_5c8._0_8_ & 0xffffffffffffff00;
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5c8._16_8_;
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbStack_5b0;
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5a8._0_8_;
      local_5a8._0_8_ = (pointer)0x0;
      local_5c8._16_8_ = (pointer)0x0;
      pbStack_5b0 = (pointer)0x0;
      local_430.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_5a8._8_8_;
      local_430.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_5a8._16_8_;
      local_430.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pUStack_590;
      pUStack_590 = (pointer)0x0;
      local_5a8._8_8_ = (pointer)0x0;
      local_5a8._16_8_ = (pointer)0x0;
      val_00.val._M_dataplus._M_p = (pointer)mtx;
      val_00._0_8_ = result;
      val_00.val._M_string_length = (size_type)coins;
      val_00.val.field_2._M_allocated_capacity = (size_type)p_Var20;
      val_00.val.field_2._8_8_ = in_stack_fffffffffffff918;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff920;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffff928;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._7_1_ = complete;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff930;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffff934;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff938;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff940;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff948;
      local_5e0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_5d0 + 8);
      UniValue::push_back(&local_4c8,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_430);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_448);
      if (local_468 != &local_458) {
        operator_delete(local_468,local_458._M_allocated_capacity + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_p != &local_188) {
        operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)(local_5a8 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_5c8 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5d0 + 8)) {
        operator_delete((void *)local_5e0._8_8_,local_5c8._0_8_ + 1);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
    } while (p_Var12 != p_Var20);
  }
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"hex","");
  CTransaction::CTransaction((CTransaction *)local_5e0,mtx);
  EncodeHexTx_abi_cxx11_((string *)local_d0,(CTransaction *)local_5e0);
  pUVar13 = result;
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_560,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  key_05._M_string_length = (size_type)mtx;
  key_05._M_dataplus._M_p = (pointer)pUVar13;
  key_05.field_2._M_allocated_capacity = (size_type)coins;
  key_05.field_2._8_8_ = p_Var20;
  val_07.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff920;
  val_07._0_8_ = in_stack_fffffffffffff918;
  val_07.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
  val_07.val._M_string_length._7_1_ = complete;
  val_07.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
  val_07.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
  val_07.val.field_2._8_8_ = in_stack_fffffffffffff938;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
  UniValue::pushKV(result,key_05,val_07);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_560.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_560.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.val._M_dataplus._M_p != &local_560.val.field_2) {
    operator_delete(local_560.val._M_dataplus._M_p,local_560.val.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_5d0 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_5e0);
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_600,"complete","");
  UniValue::UniValue<bool_&,_bool,_true>(&local_658,(bool *)&stack0xfffffffffffff92f);
  key_06._M_string_length = (size_type)mtx;
  key_06._M_dataplus._M_p = (pointer)pUVar13;
  key_06.field_2._M_allocated_capacity = (size_type)coins;
  key_06.field_2._8_8_ = p_Var20;
  val_08.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff920;
  val_08._0_8_ = in_stack_fffffffffffff918;
  val_08.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
  val_08.val._M_string_length._7_1_ = complete;
  val_08.val.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffff930;
  val_08.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
  val_08.val.field_2._8_8_ = in_stack_fffffffffffff938;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff940;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff948;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff958;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff960;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff968;
  UniValue::pushKV(result,key_06,val_08);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_658.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658.val._M_dataplus._M_p != &local_658.val.field_2) {
    operator_delete(local_658.val._M_dataplus._M_p,local_658.val.field_2._M_allocated_capacity + 1);
  }
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  if (local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_5e0._0_8_ = (pointer)local_5d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"errors","");
    bVar19 = UniValue::findKey(result,(string *)local_5e0,(size_t *)local_d0);
    if ((pointer)local_5e0._0_8_ != (pointer)local_5d0) {
      operator_delete((void *)local_5e0._0_8_,(ulong)((long)local_5d0 + 1));
    }
    if (bVar19) {
      local_5e0._0_8_ = (pointer)local_5d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"errors","");
      this = UniValue::operator[](pUVar13,(string *)local_5e0);
      vec = UniValue::getValues(this);
      UniValue::push_backV(&local_4c8,vec);
      if ((pointer)local_5e0._0_8_ != (pointer)local_5d0) {
        operator_delete((void *)local_5e0._0_8_,(ulong)((long)local_5d0 + 1));
      }
    }
    local_678[0] = local_668;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"errors","");
    pbVar9 = local_4c8.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar8 = local_4c8.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar7 = local_4c8.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar6 = local_4c8.val._M_string_length;
    paVar1 = &local_4c8.val.field_2;
    _Var21._M_p = local_4c8.val._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8.val._M_dataplus._M_p == paVar1) {
      in_stack_fffffffffffff950 =
           CONCAT17(local_4c8.val.field_2._M_local_buf[0xf],
                    CONCAT25(local_4c8.val.field_2._13_2_,
                             CONCAT41(local_4c8.val.field_2._9_4_,
                                      local_4c8.val.field_2._M_local_buf[8])));
      _Var21._M_p = (pointer)&stack0xfffffffffffff948;
    }
    uVar14._1_7_ = local_4c8.val.field_2._M_allocated_capacity._1_7_;
    uVar14._0_1_ = local_4c8.val.field_2._M_local_buf[0];
    local_4c8.val._M_string_length = 0;
    local_4c8.val.field_2._M_local_buf[0] = '\0';
    local_4c8.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4c8.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_690.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_690.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_690.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key_07._M_string_length = (size_type)mtx;
    key_07._M_dataplus._M_p = (pointer)pUVar13;
    key_07.field_2._M_allocated_capacity = (size_type)coins;
    key_07.field_2._8_8_ = p_Var20;
    val_09.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffff920;
    val_09._0_8_ = in_stack_fffffffffffff918;
    val_09.val._M_string_length._0_7_ = in_stack_fffffffffffff928;
    val_09.val._M_string_length._7_1_ = complete;
    val_09.val.field_2._M_allocated_capacity._0_4_ = local_4c8.typ;
    val_09.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffff934;
    val_09.val.field_2._8_8_ = _Var21._M_p;
    val_09.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar6;
    val_09.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar14;
    val_09.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff950;
    val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pbVar7;
    val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pbVar8;
    val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pbVar9;
    local_4c8.val._M_dataplus._M_p = (pointer)paVar1;
    UniValue::pushKV(pUVar13,key_07,val_09);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_690);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffff958);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var21._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&stack0xfffffffffffff948) {
      operator_delete(_Var21._M_p,uVar14 + 1);
    }
    if (local_678[0] != local_668) {
      operator_delete(local_678[0],local_668[0] + 1);
    }
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4c8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.val._M_dataplus._M_p != &local_4c8.val.field_2) {
    operator_delete(local_4c8.val._M_dataplus._M_p,
                    CONCAT71(local_4c8.val.field_2._M_allocated_capacity._1_7_,
                             local_4c8.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0036d321:
  __stack_chk_fail();
}

Assistant:

void SignTransactionResultToJSON(CMutableTransaction& mtx, bool complete, const std::map<COutPoint, Coin>& coins, const std::map<int, bilingual_str>& input_errors, UniValue& result)
{
    // Make errors UniValue
    UniValue vErrors(UniValue::VARR);
    for (const auto& err_pair : input_errors) {
        if (err_pair.second.original == "Missing amount") {
            // This particular error needs to be an exception for some reason
            throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Missing amount for %s", coins.at(mtx.vin.at(err_pair.first).prevout).out.ToString()));
        }
        TxInErrorToJSON(mtx.vin.at(err_pair.first), vErrors, err_pair.second.original);
    }

    result.pushKV("hex", EncodeHexTx(CTransaction(mtx)));
    result.pushKV("complete", complete);
    if (!vErrors.empty()) {
        if (result.exists("errors")) {
            vErrors.push_backV(result["errors"].getValues());
        }
        result.pushKV("errors", std::move(vErrors));
    }
}